

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O1

string * __thiscall
ICM::Instruction::Insts::JumpCompare::getToString_abi_cxx11_
          (string *__return_storage_ptr__,JumpCompare *this)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  ulong uVar8;
  size_type *psVar9;
  char cVar10;
  string __str;
  ulong *local_a0;
  uint local_98;
  undefined4 uStack_94;
  ulong local_90 [2];
  long *local_80;
  undefined8 local_78;
  long local_70;
  undefined8 uStack_68;
  ulong *local_60;
  long local_58;
  ulong local_50;
  long lStack_48;
  string local_40;
  
  Compare::getToString_abi_cxx11_(&local_40,&this->super_Compare);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_50 = *puVar7;
    lStack_48 = plVar5[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *puVar7;
    local_60 = (ulong *)*plVar5;
  }
  local_58 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  uVar1 = this->Index;
  cVar10 = '\x01';
  if (9 < uVar1) {
    uVar8 = uVar1;
    cVar4 = '\x04';
    do {
      cVar10 = cVar4;
      if (uVar8 < 100) {
        cVar10 = cVar10 + -2;
        goto LAB_00126666;
      }
      if (uVar8 < 1000) {
        cVar10 = cVar10 + -1;
        goto LAB_00126666;
      }
      if (uVar8 < 10000) goto LAB_00126666;
      bVar2 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar4 = cVar10 + '\x04';
    } while (bVar2);
    cVar10 = cVar10 + '\x01';
  }
LAB_00126666:
  local_a0 = local_90;
  std::__cxx11::string::_M_construct((ulong)&local_a0,cVar10);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_a0,local_98,uVar1);
  uVar1 = CONCAT44(uStack_94,local_98) + local_58;
  uVar8 = 0xf;
  if (local_60 != &local_50) {
    uVar8 = local_50;
  }
  if (uVar8 < uVar1) {
    uVar8 = 0xf;
    if (local_a0 != local_90) {
      uVar8 = local_90[0];
    }
    if (uVar1 <= uVar8) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_60);
      goto LAB_001266eb;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_a0);
LAB_001266eb:
  local_80 = &local_70;
  plVar5 = puVar6 + 2;
  if ((long *)*puVar6 == plVar5) {
    local_70 = *plVar5;
    uStack_68 = puVar6[3];
  }
  else {
    local_70 = *plVar5;
    local_80 = (long *)*puVar6;
  }
  local_78 = puVar6[1];
  *puVar6 = plVar5;
  puVar6[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    lVar3 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,local_50 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string getToString() const { return  Compare::getToString() + ", {" + std::to_string(Index) + "}"; }